

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,char_const*,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char *significand,
          int significand_size,int integral_size,char16_t decimal_point,
          digit_grouping<char16_t> *grouping)

{
  char16_t cVar1;
  type tVar2;
  char16_t *pcVar3;
  char16_t *end;
  basic_string_view<char16_t> local_490;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_480;
  buffer<char16_t> *local_478;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_470 [3];
  allocator<char16_t> local_451;
  undefined1 local_450 [8];
  basic_memory_buffer<char16_t,_500UL,_std::allocator<char16_t>_> buffer;
  digit_grouping<char16_t> *grouping_local;
  char16_t decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out_local;
  
  cVar1 = digit_grouping<char16_t>::separator(grouping);
  if (cVar1 == L'\0') {
    buffer._1032_8_ = out.container;
    out_local = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
                          (out,significand,significand_size,integral_size,decimal_point);
  }
  else {
    std::allocator<char16_t>::allocator(&local_451);
    basic_memory_buffer<char16_t,_500UL,_std::allocator<char16_t>_>::basic_memory_buffer
              ((basic_memory_buffer<char16_t,_500UL,_std::allocator<char16_t>_> *)local_450,
               &local_451);
    std::allocator<char16_t>::~allocator(&local_451);
    std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::back_insert_iterator
              (local_470,(buffer<char16_t> *)local_450);
    local_478 = (buffer<char16_t> *)
                write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
                          (local_470[0],significand,significand_size,integral_size,decimal_point);
    local_480.container = out.container;
    pcVar3 = buffer<char16_t>::data((buffer<char16_t> *)local_450);
    tVar2 = to_unsigned<int>(integral_size);
    basic_string_view<char16_t>::basic_string_view(&local_490,pcVar3,(ulong)tVar2);
    digit_grouping<char16_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
              (grouping,local_480,local_490);
    pcVar3 = buffer<char16_t>::data((buffer<char16_t> *)local_450);
    end = buffer<char16_t>::end((buffer<char16_t> *)local_450);
    out_local = copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                          (pcVar3 + integral_size,end,out);
    basic_memory_buffer<char16_t,_500UL,_std::allocator<char16_t>_>::~basic_memory_buffer
              ((basic_memory_buffer<char16_t,_500UL,_std::allocator<char16_t>_> *)local_450);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}